

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ModelCreationUtils.cpp
# Opt level: O1

NeuralNetwork *
addInnerProductLayer
          (Model *m,bool isUpdatable,char *name,TensorAttributes *inTensorAttr,
          TensorAttributes *outTensorAttr,bool areWeightsQuantized,bool isBiasQuantized)

{
  RepeatedField<float> *pRVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  ulong uVar5;
  Rep *pRVar6;
  ConvolutionLayerParams *pCVar7;
  long lVar8;
  void *pvVar9;
  long lVar10;
  NeuralNetwork *pNVar11;
  NeuralNetworkLayer *pNVar12;
  InnerProductLayerParams *pIVar13;
  WeightParams *pWVar14;
  QuantizationParams *pQVar15;
  LinearQuantizationParams *pLVar16;
  float *pfVar17;
  undefined8 *puVar18;
  Arena *pAVar19;
  
  if (m->_oneof_case_[0] != 500) {
    CoreML::Specification::Model::clear_Type(m);
    m->_oneof_case_[0] = 500;
    uVar5 = (m->super_MessageLite)._internal_metadata_.ptr_;
    pAVar19 = (Arena *)(uVar5 & 0xfffffffffffffffc);
    if ((uVar5 & 1) != 0) {
      pAVar19 = *(Arena **)pAVar19;
    }
    pNVar11 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::NeuralNetwork>
                        (pAVar19);
    (m->Type_).neuralnetwork_ = pNVar11;
  }
  pNVar11 = (NeuralNetwork *)(m->Type_).treeensembleclassifier_;
  pRVar6 = (pNVar11->layers_).super_RepeatedPtrFieldBase.rep_;
  if (pRVar6 != (Rep *)0x0) {
    iVar2 = (pNVar11->layers_).super_RepeatedPtrFieldBase.current_size_;
    if (iVar2 < pRVar6->allocated_size) {
      (pNVar11->layers_).super_RepeatedPtrFieldBase.current_size_ = iVar2 + 1;
      pNVar12 = (NeuralNetworkLayer *)pRVar6->elements[iVar2];
      goto LAB_0020110c;
    }
  }
  pNVar12 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::NeuralNetworkLayer>
                      ((pNVar11->layers_).super_RepeatedPtrFieldBase.arena_);
  pNVar12 = (NeuralNetworkLayer *)
            google::protobuf::internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                      (&(pNVar11->layers_).super_RepeatedPtrFieldBase,pNVar12);
LAB_0020110c:
  uVar5 = (pNVar12->super_MessageLite)._internal_metadata_.ptr_;
  puVar18 = (undefined8 *)(uVar5 & 0xfffffffffffffffc);
  if ((uVar5 & 1) != 0) {
    puVar18 = (undefined8 *)*puVar18;
  }
  google::protobuf::internal::ArenaStringPtr::
  Set<google::protobuf::internal::ArenaStringPtr::EmptyDefault>(&pNVar12->name_,name,puVar18);
  CoreML::Specification::NeuralNetworkLayer::add_input(pNVar12,inTensorAttr->name);
  CoreML::Specification::NeuralNetworkLayer::add_output(pNVar12,outTensorAttr->name);
  if (pNVar12->_oneof_case_[0] != 0x8c) {
    CoreML::Specification::NeuralNetworkLayer::clear_layer(pNVar12);
    pNVar12->_oneof_case_[0] = 0x8c;
    uVar5 = (pNVar12->super_MessageLite)._internal_metadata_.ptr_;
    pAVar19 = (Arena *)(uVar5 & 0xfffffffffffffffc);
    if ((uVar5 & 1) != 0) {
      pAVar19 = *(Arena **)pAVar19;
    }
    pIVar13 = google::protobuf::Arena::
              CreateMaybeMessage<CoreML::Specification::InnerProductLayerParams>(pAVar19);
    (pNVar12->layer_).innerproduct_ = pIVar13;
  }
  pCVar7 = (pNVar12->layer_).convolution_;
  *(undefined8 *)&pCVar7->_kernelsize_cached_byte_size_ = 1;
  (pCVar7->stride_).current_size_ = 1;
  (pCVar7->stride_).total_size_ = 0;
  lVar8._0_4_ = (pCVar7->kernelsize_).current_size_;
  lVar8._4_4_ = (pCVar7->kernelsize_).total_size_;
  if (lVar8 == 0) {
    uVar5 = (pCVar7->super_MessageLite)._internal_metadata_.ptr_;
    pAVar19 = (Arena *)(uVar5 & 0xfffffffffffffffc);
    if ((uVar5 & 1) != 0) {
      pAVar19 = *(Arena **)pAVar19;
    }
    pWVar14 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::WeightParams>
                        (pAVar19);
    *(WeightParams **)&pCVar7->kernelsize_ = pWVar14;
  }
  lVar8 = *(long *)&pCVar7->kernelsize_;
  if (areWeightsQuantized) {
    if (*(long *)(lVar8 + 0x38) == 0) {
      pAVar19 = (Arena *)(*(ulong *)(lVar8 + 8) & 0xfffffffffffffffc);
      if ((*(ulong *)(lVar8 + 8) & 1) != 0) {
        pAVar19 = *(Arena **)pAVar19;
      }
      pQVar15 = google::protobuf::Arena::
                CreateMaybeMessage<CoreML::Specification::QuantizationParams>(pAVar19);
      *(QuantizationParams **)(lVar8 + 0x38) = pQVar15;
    }
    pQVar15 = *(QuantizationParams **)(lVar8 + 0x38);
    pQVar15->numberofbits_ = 1;
    if (pQVar15->_oneof_case_[0] != 0x65) {
      CoreML::Specification::QuantizationParams::clear_QuantizationType(pQVar15);
      pQVar15->_oneof_case_[0] = 0x65;
      uVar5 = (pQVar15->super_MessageLite)._internal_metadata_.ptr_;
      pAVar19 = (Arena *)(uVar5 & 0xfffffffffffffffc);
      if ((uVar5 & 1) != 0) {
        pAVar19 = *(Arena **)pAVar19;
      }
      pLVar16 = google::protobuf::Arena::
                CreateMaybeMessage<CoreML::Specification::LinearQuantizationParams>(pAVar19);
      (pQVar15->QuantizationType_).linearquantization_ = pLVar16;
    }
    pLVar16 = (pQVar15->QuantizationType_).linearquantization_;
    uVar3 = (pLVar16->scale_).current_size_;
    uVar4 = (pLVar16->scale_).total_size_;
    if (uVar3 == uVar4) {
      google::protobuf::RepeatedField<float>::Reserve(&pLVar16->scale_,uVar4 + 1);
    }
    pfVar17 = google::protobuf::RepeatedField<float>::elements(&pLVar16->scale_);
    pfVar17[uVar3] = 1.0;
    (pLVar16->scale_).current_size_ = uVar3 + 1;
    pRVar1 = &pLVar16->bias_;
    uVar3 = (pLVar16->bias_).current_size_;
    uVar4 = (pLVar16->bias_).total_size_;
    if (uVar3 == uVar4) {
      google::protobuf::RepeatedField<float>::Reserve(pRVar1,uVar4 + 1);
    }
    pfVar17 = google::protobuf::RepeatedField<float>::elements(pRVar1);
    pfVar17[uVar3] = 0.0;
    pRVar1->current_size_ = uVar3 + 1;
    puVar18 = (undefined8 *)(*(ulong *)(lVar8 + 8) & 0xfffffffffffffffc);
    if ((*(ulong *)(lVar8 + 8) & 1) != 0) {
      puVar18 = (undefined8 *)*puVar18;
    }
    google::protobuf::internal::ArenaStringPtr::
    Set<google::protobuf::internal::ArenaStringPtr::EmptyDefault>
              ((ArenaStringPtr *)(lVar8 + 0x30),"x01",puVar18);
  }
  else {
    pRVar1 = (RepeatedField<float> *)(lVar8 + 0x10);
    uVar3 = *(uint *)(lVar8 + 0x10);
    if (uVar3 == *(uint *)(lVar8 + 0x14)) {
      google::protobuf::RepeatedField<float>::Reserve(pRVar1,*(uint *)(lVar8 + 0x14) + 1);
    }
    pfVar17 = google::protobuf::RepeatedField<float>::elements(pRVar1);
    pfVar17[uVar3] = 1.0;
    pRVar1->current_size_ = uVar3 + 1;
  }
  *(undefined1 *)&(pCVar7->stride_).arena_or_elements_ = 1;
  if ((pCVar7->kernelsize_).arena_or_elements_ == (void *)0x0) {
    uVar5 = (pCVar7->super_MessageLite)._internal_metadata_.ptr_;
    pAVar19 = (Arena *)(uVar5 & 0xfffffffffffffffc);
    if ((uVar5 & 1) != 0) {
      pAVar19 = *(Arena **)pAVar19;
    }
    pWVar14 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::WeightParams>
                        (pAVar19);
    (pCVar7->kernelsize_).arena_or_elements_ = pWVar14;
  }
  pvVar9 = (pCVar7->kernelsize_).arena_or_elements_;
  if (isBiasQuantized) {
    if (*(long *)((long)pvVar9 + 0x38) == 0) {
      pAVar19 = (Arena *)(*(ulong *)((long)pvVar9 + 8) & 0xfffffffffffffffc);
      if ((*(ulong *)((long)pvVar9 + 8) & 1) != 0) {
        pAVar19 = *(Arena **)pAVar19;
      }
      pQVar15 = google::protobuf::Arena::
                CreateMaybeMessage<CoreML::Specification::QuantizationParams>(pAVar19);
      *(QuantizationParams **)((long)pvVar9 + 0x38) = pQVar15;
    }
    pQVar15 = *(QuantizationParams **)((long)pvVar9 + 0x38);
    pQVar15->numberofbits_ = 1;
    if (pQVar15->_oneof_case_[0] != 0x65) {
      CoreML::Specification::QuantizationParams::clear_QuantizationType(pQVar15);
      pQVar15->_oneof_case_[0] = 0x65;
      uVar5 = (pQVar15->super_MessageLite)._internal_metadata_.ptr_;
      pAVar19 = (Arena *)(uVar5 & 0xfffffffffffffffc);
      if ((uVar5 & 1) != 0) {
        pAVar19 = *(Arena **)pAVar19;
      }
      pLVar16 = google::protobuf::Arena::
                CreateMaybeMessage<CoreML::Specification::LinearQuantizationParams>(pAVar19);
      (pQVar15->QuantizationType_).linearquantization_ = pLVar16;
    }
    pLVar16 = (pQVar15->QuantizationType_).linearquantization_;
    uVar3 = (pLVar16->scale_).current_size_;
    uVar4 = (pLVar16->scale_).total_size_;
    if (uVar3 == uVar4) {
      google::protobuf::RepeatedField<float>::Reserve(&pLVar16->scale_,uVar4 + 1);
    }
    pfVar17 = google::protobuf::RepeatedField<float>::elements(&pLVar16->scale_);
    pfVar17[uVar3] = 1.0;
    (pLVar16->scale_).current_size_ = uVar3 + 1;
    pRVar1 = &pLVar16->bias_;
    uVar3 = (pLVar16->bias_).current_size_;
    uVar4 = (pLVar16->bias_).total_size_;
    if (uVar3 == uVar4) {
      google::protobuf::RepeatedField<float>::Reserve(pRVar1,uVar4 + 1);
    }
    pfVar17 = google::protobuf::RepeatedField<float>::elements(pRVar1);
    pfVar17[uVar3] = 0.0;
    pRVar1->current_size_ = uVar3 + 1;
    puVar18 = (undefined8 *)(*(ulong *)((long)pvVar9 + 8) & 0xfffffffffffffffc);
    if ((*(ulong *)((long)pvVar9 + 8) & 1) != 0) {
      puVar18 = (undefined8 *)*puVar18;
    }
    google::protobuf::internal::ArenaStringPtr::
    Set<google::protobuf::internal::ArenaStringPtr::EmptyDefault>
              ((ArenaStringPtr *)((long)pvVar9 + 0x30),"x01",puVar18);
  }
  else {
    pRVar1 = (RepeatedField<float> *)((long)pvVar9 + 0x10);
    uVar3 = *(uint *)((long)pvVar9 + 0x10);
    if (uVar3 == *(uint *)((long)pvVar9 + 0x14)) {
      google::protobuf::RepeatedField<float>::Reserve(pRVar1,*(uint *)((long)pvVar9 + 0x14) + 1);
    }
    pfVar17 = google::protobuf::RepeatedField<float>::elements(pRVar1);
    pfVar17[uVar3] = 1.0;
    pRVar1->current_size_ = uVar3 + 1;
  }
  if (isUpdatable) {
    pNVar12->isupdatable_ = true;
    lVar10._0_4_ = (pCVar7->kernelsize_).current_size_;
    lVar10._4_4_ = (pCVar7->kernelsize_).total_size_;
    if (lVar10 == 0) {
      uVar5 = (pCVar7->super_MessageLite)._internal_metadata_.ptr_;
      pAVar19 = (Arena *)(uVar5 & 0xfffffffffffffffc);
      if ((uVar5 & 1) != 0) {
        pAVar19 = *(Arena **)pAVar19;
      }
      pWVar14 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::WeightParams>
                          (pAVar19);
      *(WeightParams **)&pCVar7->kernelsize_ = pWVar14;
    }
    *(undefined1 *)(*(long *)&pCVar7->kernelsize_ + 0x40) = 1;
    if ((pCVar7->kernelsize_).arena_or_elements_ == (void *)0x0) {
      uVar5 = (pCVar7->super_MessageLite)._internal_metadata_.ptr_;
      pAVar19 = (Arena *)(uVar5 & 0xfffffffffffffffc);
      if ((uVar5 & 1) != 0) {
        pAVar19 = *(Arena **)pAVar19;
      }
      pWVar14 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::WeightParams>
                          (pAVar19);
      (pCVar7->kernelsize_).arena_or_elements_ = pWVar14;
    }
    *(undefined1 *)((long)(pCVar7->kernelsize_).arena_or_elements_ + 0x40) = 1;
  }
  return pNVar11;
}

Assistant:

Specification::NeuralNetwork* addInnerProductLayer(Specification::Model& m, bool isUpdatable, const char *name, const TensorAttributes *inTensorAttr, const TensorAttributes *outTensorAttr, bool areWeightsQuantized, bool isBiasQuantized) {
    
    auto neuralNet = m.mutable_neuralnetwork();
    auto layer = neuralNet->add_layers();
    
    layer->set_name(name);
    layer->add_input(inTensorAttr->name);
    layer->add_output(outTensorAttr->name);
    Specification::InnerProductLayerParams *innerProductParams = layer->mutable_innerproduct();
    innerProductParams->set_inputchannels(1);
    innerProductParams->set_outputchannels(1);

    // set weight
    auto* weights = innerProductParams->mutable_weights();
    if (areWeightsQuantized) {
        auto *quant_params = weights->mutable_quantization();
        quant_params->set_numberofbits(1);
        auto *linear_quant_params = quant_params->mutable_linearquantization();
        linear_quant_params->add_scale(1.0f);
        linear_quant_params->add_bias(0.0f);
        weights->set_int8rawvalue("x01"); // this is [1]
    } else {
        weights->add_floatvalue(1.0);
    }

    // set bias
    innerProductParams->set_hasbias(true);
    auto* bias = innerProductParams->mutable_bias();
    if (isBiasQuantized) {
        auto *quant_params = bias->mutable_quantization();
        quant_params->set_numberofbits(1);
        auto *linear_quant_params = quant_params->mutable_linearquantization();
        linear_quant_params->add_scale(1.0f);
        linear_quant_params->add_bias(0.0f);
        bias->set_int8rawvalue("x01"); // this is [1]
    } else {
        bias->add_floatvalue(1.0);
    }
    
    if (isUpdatable) {
        layer->set_isupdatable(true);
        innerProductParams->mutable_weights()->set_isupdatable(true);
        innerProductParams->mutable_bias()->set_isupdatable(true);
    }

    return neuralNet;
}